

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera_source.c
# Opt level: O0

RK_S32 camera_source_get_frame(CamSource *ctx)

{
  RK_S32 RVar1;
  undefined1 local_118 [8];
  v4l2_plane planes [1];
  undefined1 local_d0 [92];
  v4l2_buf_type local_74;
  uint local_70;
  v4l2_buf_type type;
  v4l2_buffer buf;
  CamSource *ctx_local;
  
  local_74 = ctx->type;
  buf._80_8_ = ctx;
  memset(local_d0,0,0x58);
  memcpy(&local_70,local_d0,0x58);
  type = local_74;
  buf.timecode.userbits[0] = '\x01';
  buf.timecode.userbits[1] = '\0';
  buf.timecode.userbits[2] = '\0';
  buf.timecode.userbits[3] = '\0';
  if (local_74 == V4L2_BUF_TYPE_VIDEO_CAPTURE_MPLANE) {
    buf._56_8_ = local_118;
    buf.m.offset = 1;
  }
  RVar1 = camera_source_ioctl(*(RK_S32 *)buf._80_8_,-0x3fa7a9ef,&local_70);
  if (RVar1 == -1) {
    _mpp_log_l(2,"camera_source","VIDIOC_DQBUF\n","camera_source_get_frame");
    ctx_local._4_4_ = 0xffffffff;
  }
  else if (*(uint *)(buf._80_8_ + 4) < local_70) {
    _mpp_log_l(2,"camera_source","buffer index out of bounds\n","camera_source_get_frame");
    ctx_local._4_4_ = 0xffffffff;
  }
  else {
    ctx_local._4_4_ = local_70;
  }
  return ctx_local._4_4_;
}

Assistant:

RK_S32 camera_source_get_frame(CamSource *ctx)
{
    struct v4l2_buffer buf;
    enum v4l2_buf_type type;

    type = ctx->type;
    buf = (struct v4l2_buffer) {0};
    buf.type   = type;
    buf.memory = V4L2_MEMORY_MMAP;

    struct v4l2_plane planes[FMT_NUM_PLANES];
    if (V4L2_BUF_TYPE_VIDEO_CAPTURE_MPLANE == type) {
        buf.m.planes = planes;
        buf.length = FMT_NUM_PLANES;
    }

    if (-1 == camera_source_ioctl(ctx->fd, VIDIOC_DQBUF, &buf)) {
        mpp_err_f("VIDIOC_DQBUF\n");
        return -1;
    }

    if (buf.index > ctx->bufcnt) {
        mpp_err_f("buffer index out of bounds\n");
        return -1;
    }

    if (V4L2_BUF_TYPE_VIDEO_CAPTURE_MPLANE == type)
        buf.bytesused = buf.m.planes[0].bytesused;

    return buf.index;
}